

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O0

void IDAAbckpbDelete(IDABMem *IDAB_memPtr)

{
  undefined8 *in_RDI;
  void *ida_mem;
  IDABMem IDAB_mem;
  void **ida_mem_00;
  
  ida_mem_00 = (void **)*in_RDI;
  if (ida_mem_00 != (void **)0x0) {
    *in_RDI = ida_mem_00[0x10];
    IDAFree(ida_mem_00);
    if (ida_mem_00[10] != (void *)0x0) {
      (*(code *)ida_mem_00[10])(ida_mem_00);
    }
    if (ida_mem_00[0xc] != (void *)0x0) {
      (*(code *)ida_mem_00[0xc])(ida_mem_00);
    }
    N_VDestroy(ida_mem_00[0xe]);
    N_VDestroy(ida_mem_00[0xf]);
    free(ida_mem_00);
  }
  return;
}

Assistant:

static void IDAAbckpbDelete(IDABMem* IDAB_memPtr)
{
  IDABMem IDAB_mem = (*IDAB_memPtr);
  void* ida_mem;

  if (IDAB_mem == NULL) { return; }

  /* Move head to the next element in list. */
  *IDAB_memPtr = IDAB_mem->ida_next;

  /* IDAB_mem is going to be deallocated. */

  /* Free IDAS memory for this backward problem. */
  ida_mem = (void*)IDAB_mem->IDA_mem;
  IDAFree(&ida_mem);

  /* Free linear solver memory. */
  if (IDAB_mem->ida_lfree != NULL) { IDAB_mem->ida_lfree(IDAB_mem); }

  /* Free preconditioner memory. */
  if (IDAB_mem->ida_pfree != NULL) { IDAB_mem->ida_pfree(IDAB_mem); }

  /* Free any workspace vectors. */
  N_VDestroy(IDAB_mem->ida_yy);
  N_VDestroy(IDAB_mem->ida_yp);

  /* Free the node itself. */
  free(IDAB_mem);
  IDAB_mem = NULL;
}